

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,char **args,char **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Printer *this_00;
  pointer pcVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_eb;
  allocator local_ea;
  allocator local_e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = this->printer_;
  std::__cxx11::string::string((string *)&local_50,*args,&local_e9);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_50 + local_48);
  std::__cxx11::string::string((string *)&local_d0,*args_1,&local_ea);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,local_d0,local_d0 + local_c8);
  local_70[0] = local_60;
  pcVar1 = (args_2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + args_2->_M_string_length);
  __l._M_len = 3;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l,&local_eb);
  io::Printer::FormatInternal(this_00,&local_e8,&this->vars_,format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  lVar2 = 0;
  do {
    if (local_60 + lVar2 != *(undefined1 **)((long)local_70 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_70 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }